

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindAllExtensionNumbers
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
          vector<int,_std::allocator<int>_> *output)

{
  __type _Var1;
  iterator iVar2;
  bool bVar3;
  key_type kStack_58;
  
  std::__cxx11::string::string((string *)&kStack_58,(string *)containing_type);
  kStack_58.second = 0;
  iVar2 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
          ::lower_bound(&(this->by_extension_)._M_t,&kStack_58);
  std::__cxx11::string::~string((string *)&kStack_58);
  bVar3 = false;
  while( true ) {
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->by_extension_)._M_t._M_impl.super__Rb_tree_header) {
      return bVar3;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar2._M_node + 1),containing_type);
    if (!_Var1) break;
    std::vector<int,_std::allocator<int>_>::push_back
              (output,(value_type_conflict2 *)(iVar2._M_node + 2));
    iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllExtensionNumbers(
    const std::string& containing_type, std::vector<int>* output) {
  typename std::map<std::pair<std::string, int>, Value>::const_iterator it =
      by_extension_.lower_bound(std::make_pair(containing_type, 0));
  bool success = false;

  for (; it != by_extension_.end() && it->first.first == containing_type;
       ++it) {
    output->push_back(it->first.second);
    success = true;
  }

  return success;
}